

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

UBool __thiscall icu_63::Normalizer2Impl::hasDecompBoundaryAfter(Normalizer2Impl *this,UChar32 c)

{
  UBool UVar1;
  uint16_t norm16;
  
  if (c < (int)(uint)(ushort)this->minDecompNoCP) {
    return '\x01';
  }
  if (c < 0x10000) {
    if (this->smallFCD[c >> 8] == 0) {
      return '\x01';
    }
    if ((1 << ((byte)c >> 5) & (uint)this->smallFCD[c >> 8]) == 0) {
      return '\x01';
    }
  }
  norm16 = getNorm16(this,c);
  UVar1 = norm16HasDecompBoundaryAfter(this,norm16);
  return UVar1;
}

Assistant:

UBool Normalizer2Impl::hasDecompBoundaryAfter(UChar32 c) const {
    if (c < minDecompNoCP) {
        return TRUE;
    }
    if (c <= 0xffff && !singleLeadMightHaveNonZeroFCD16(c)) {
        return TRUE;
    }
    return norm16HasDecompBoundaryAfter(getNorm16(c));
}